

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O3

void __thiscall Symbol::Symbol(Symbol *this,SymbolName *name,ParseNode *decl,SymbolType symbolType)

{
  char16_t *pcVar1;
  bool bVar2;
  undefined3 in_register_00000009;
  
  pcVar1 = (name->string).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->name).string.ptr = pcVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->name).len = name->len;
  this->pid = (IdentPtr)0x0;
  this->decl = decl;
  this->scope = (Scope *)0x0;
  this->position = -1;
  this->location = 0xffffffff;
  this->scopeSlot = -1;
  this->moduleIndex = -1;
  this->next = (Symbol *)0x0;
  this->defCount = '\0';
  *(undefined2 *)&this->field_0x42 = 0;
  this->field_0x44 = this->field_0x44 & 0x80;
  this->isNonSimpleParameter = false;
  this->assignmentState = NotAssigned;
  this->symbolType = symbolType;
  this->hasMaybeEscapedUse = CONCAT31(in_register_00000009,symbolType) == 3;
  this->hasFuncAssignment = CONCAT31(in_register_00000009,symbolType) == 0;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase);
  if ((bVar2) && (this->hasFuncAssignment == true)) {
    Output::Print(L"HasFuncDecl: %s\n",(this->name).string.ptr);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

Symbol(SymbolName const& name, ParseNode* decl, SymbolType symbolType) :
        name(name),
        pid(nullptr),
        decl(decl),
        scope(nullptr),
        position(Js::Constants::NoProperty),
        location(Js::Constants::NoRegister),
        scopeSlot(Js::Constants::NoProperty),
        moduleIndex(Js::Constants::NoProperty),
        next(nullptr),
        symbolType(symbolType), // will get set to the same value in SetSymbolType
        defCount(0),
        needDeclaration(false),
        isBlockVar(false),
        isConst(false),
        isGlobal(false),
        hasNonLocalReference(false),
        isFuncExpr(false),
        isCatch(false),
        hasInit(false),
        isUsed(false),
        isGlobalCatch(false),
        isCommittedToSlot(false),
        hasNonCommittedReference(false),
        hasVisitedCapturingFunc(false),
        isTrackedForDebugger(false),
        isModuleExportStorage(false),
        isModuleImport(false),
        isUsedInLdElem(false),
        isThis(false),
        isNewTarget(false),
        isSuper(false),
        isSuperConstructor(false),
        isImportMeta(false),
        needsScopeObject(false),
        hasFuncAssignment(false), // will get reset by SetSymbolType
        hasMaybeEscapedUse(false), // will get reset by SetSymbolType
        isNonSimpleParameter(false),
        assignmentState(NotAssigned)
    {
        SetSymbolType(symbolType);

        if (PHASE_TESTTRACE1(Js::StackFuncPhase) && hasFuncAssignment)
        {
            Output::Print(_u("HasFuncDecl: %s\n"), this->GetName().GetBuffer());
            Output::Flush();
        }
    }